

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_rand_str(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int local_42c;
  char local_428 [4];
  int iLen;
  char zString [1024];
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  local_42c = 0x10;
  if ((0 < nArg) && ((local_42c = jx9_value_to_int(*apArg), local_42c < 1 || (0x400 < local_42c))))
  {
    local_42c = 0x10;
  }
  jx9VmRandomString(pCtx->pVm,local_428,local_42c);
  jx9_result_string(pCtx,local_428,local_42c);
  return 0;
}

Assistant:

static int vm_builtin_rand_str(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	char zString[1024];
	int iLen = 0x10;
	if( nArg > 0 ){
		/* Get the desired length */
		iLen = jx9_value_to_int(apArg[0]);
		if( iLen < 1 || iLen > 1024 ){
			/* Default length */
			iLen = 0x10;
		}
	}
	/* Generate the random string */
	jx9VmRandomString(pCtx->pVm, zString, iLen);
	/* Return the generated string */
	jx9_result_string(pCtx, zString, iLen); /* Will make it's own copy */
	return SXRET_OK;
}